

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

bool __thiscall
Protocol::MQTT::V5::Property<Protocol::MQTT::Common::DynamicStringPair>::acceptVisitor
          (Property<Protocol::MQTT::Common::DynamicStringPair> *this,VisitorVariant *visitor)

{
  MemMappedPropertyRegistry *this_00;
  
  this_00 = MemMappedPropertyRegistry::getInstance();
  MemMappedPropertyRegistry::getVisitorForProperty(this_00,visitor,(this->super_PropertyBase).type);
  return false;
}

Assistant:

bool acceptVisitor(VisitorVariant & visitor) const
                {
                    if (!PropertyBase::acceptVisitor(visitor)) return false;
                    DynamicStringPairView * view = visitor.as<DynamicStringPairView>();
                    if (!view) return false;
                    view->key = value.key;
                    view->value = value.value;
                    return true;
                }